

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition.c
# Opt level: O1

hd_part * hd_open_part(hd_context *ctx,hd_disk *disk,char *partname)

{
  hd_part_handler_context *phVar1;
  int iVar2;
  hd_part *phVar3;
  char *fmt;
  long lVar4;
  bool bVar5;
  
  if (partname == (char *)0x0) {
    fmt = "no part to open";
  }
  else {
    phVar1 = ctx->part;
    if (phVar1->count == 0) {
      fmt = "No part handlers registered";
    }
    else {
      if (0 < phVar1->count) {
        lVar4 = 0;
        do {
          phVar3 = (*phVar1->handler[lVar4]->open)(ctx,disk,partname);
          phVar3->name = partname;
          if (phVar3->probe_part == (hd_part_probe_fn *)0x0) {
            bVar5 = false;
          }
          else {
            iVar2 = (*phVar3->probe_part)(ctx,disk,phVar3);
            bVar5 = iVar2 == 1;
          }
          if (bVar5) {
            return phVar3;
          }
          hd_drop_disk(ctx,disk);
          lVar4 = lVar4 + 1;
        } while (lVar4 < phVar1->count);
      }
      fmt = "Could not find the specified part handler";
    }
  }
  hd_throw(ctx,2,fmt);
}

Assistant:

hd_part *
hd_open_part(hd_context *ctx, hd_disk *disk, const char *partname)
{
    int i;
    hd_part_handler_context *ph;

    if (partname == NULL)
        hd_throw(ctx, HD_ERROR_GENERIC, "no part to open");

    ph = ctx->part;
    if (ph->count == 0)
        hd_throw(ctx, HD_ERROR_GENERIC, "No part handlers registered");

    for (i = 0; i < ph->count; i++)
    {
        int rc = 0;
        hd_part *part;
        part = ph->handler[i]->open(ctx, disk, partname);
        part->name = partname;
        if (part->probe_part)
            rc = part->probe_part(ctx, disk, part);


        if(rc != 1)
        {
            hd_drop_disk(ctx, disk);
            continue;
        }

        return part;
    }

    hd_throw(ctx, HD_ERROR_GENERIC, "Could not find the specified part handler");
}